

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall ctemplate::BaseArena::FreeBlocks(BaseArena *this)

{
  AllocatedBlock *pAVar1;
  pointer pAVar2;
  long lVar3;
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar4;
  
  if (1 < this->blocks_alloced_) {
    pAVar1 = this->first_blocks_;
    lVar3 = 1;
    do {
      pAVar1 = pAVar1 + 1;
      free(pAVar1->mem);
      lVar3 = lVar3 + 1;
      pAVar1->mem = (char *)0x0;
      pAVar1->size = 0;
    } while (lVar3 < this->blocks_alloced_);
  }
  this->blocks_alloced_ = 1;
  pvVar4 = this->overflow_blocks_;
  if (pvVar4 != (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 *)0x0) {
    pAVar2 = (pvVar4->
             super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pAVar2 != (pvVar4->
                  super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        free(pAVar2->mem);
        pAVar2 = pAVar2 + 1;
        pvVar4 = this->overflow_blocks_;
      } while (pAVar2 != (pvVar4->
                         super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      pAVar2 = (pvVar4->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    if (pAVar2 != (pointer)0x0) {
      operator_delete(pAVar2);
    }
    operator_delete(pvVar4);
    this->overflow_blocks_ =
         (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
          *)0x0;
  }
  return;
}

Assistant:

void BaseArena::FreeBlocks() {
  for ( int i = 1; i < blocks_alloced_; ++i ) {  // keep first block alloced
    free(first_blocks_[i].mem);
    first_blocks_[i].mem = NULL;
    first_blocks_[i].size = 0;
  }
  blocks_alloced_ = 1;
  if (overflow_blocks_ != NULL) {
    vector<AllocatedBlock>::iterator it;
    for (it = overflow_blocks_->begin(); it != overflow_blocks_->end(); ++it) {
      free(it->mem);
    }
    delete overflow_blocks_;             // These should be used very rarely
    overflow_blocks_ = NULL;
  }
}